

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O2

void __thiscall tt::net::EventLoop::~EventLoop(EventLoop *this)

{
  long in_FS_OFFSET;
  
  close(this->m_wakeupFd);
  *(undefined8 *)(in_FS_OFFSET + -0x40) = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_wakeupChannel).
              super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->m_pendingFunctors);
  MutexLock::~MutexLock(&this->m_mutex);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_epoll).super___shared_ptr<tt::net::Epoll,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

EventLoop::~EventLoop(){
	
	close(m_wakeupFd);
	t_loopInTishThread = NULL;
}